

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rough_conductor.hpp
# Opt level: O3

void __thiscall RoughConductorBRDF::sample_f(RoughConductorBRDF *this)

{
  vec3f *in_RCX;
  vec3f *in_RDX;
  Color *in_RSI;
  float *in_R8;
  Sampler *in_R9;
  
  sample_f((RoughConductorBRDF *)
           ((long)&(this->super_BRDF)._vptr_BRDF + (long)(this->super_BRDF)._vptr_BRDF[-4]),in_RSI,
           in_RDX,in_RCX,in_R8,in_R9);
  return;
}

Assistant:

Color sample_f(const Color& albedo, const vec3f& wo, vec3f& wi, float& pdf, Sampler& sampler) const override
	{
		vec2f u = sampler.get2f();
    	vec3f wm = schuttejoe::GgxVndf(wo, alpha, u.x, u.y);
		wi = 2*dot(wm,wo)*wm-wo;
		// http://jcgt.org/published/0007/04/01/paper.pdf Eric Heitz
		pdf = EDX::Smith_G1(wi, wm, alpha) * EDX::GGX_D(wm,alpha) * fabs(dot(wo,wm)) / (4 * fabs(dot(wi, wm)) * fabs(wo.z));
    	if (wi.z<0 ^ wo.z<0) return 0;
    	return f(albedo, wo, wi);
	}